

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_copy(lua_State *L)

{
  void *__dest;
  void *__src;
  TValue *pTVar1;
  uint local_2c;
  CTSize len;
  TValue *o;
  void *sp;
  void *dp;
  lua_State *L_local;
  
  __dest = ffi_checkptr(L,1,0x11);
  __src = ffi_checkptr(L,2,0x12);
  pTVar1 = L->base + 1;
  if (((int)(pTVar1->field_4).it >> 0xf == -5) && (L->top <= L->base + 2)) {
    local_2c = *(int *)((pTVar1->u64 & 0x7fffffffffff) + 0x14) + 1;
  }
  else {
    local_2c = ffi_checkint(L,3);
  }
  memcpy(__dest,__src,(ulong)local_2c);
  return 0;
}

Assistant:

LJLIB_CF(ffi_copy)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  void *sp = ffi_checkptr(L, 2, CTID_P_CVOID);
  TValue *o = L->base+1;
  CTSize len;
  if (tvisstr(o) && o+1 >= L->top)
    len = strV(o)->len+1;  /* Copy Lua string including trailing '\0'. */
  else
    len = (CTSize)ffi_checkint(L, 3);
  memcpy(dp, sp, len);
  return 0;
}